

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

exit_table_type<const_vending::events::power_off_&> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::vending_def::on::serving,unsigned_long>
::exit_table<vending::events::power_off_const&,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  int iVar1;
  final_state_exit_func<1UL> local_12;
  final_state_exit_func<0UL> local_11;
  indexes_tuple<0UL,_1UL> *local_10;
  indexes_tuple<0UL,_1UL> *param_1_local;
  
  if (exit_table<vending::events::power_off_const&,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
      ::_table == '\0') {
    local_10 = param_1;
    iVar1 = __cxa_guard_acquire(&exit_table<vending::events::power_off_const&,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      std::
      function<void(std::tuple<afsm::state<vending::vending_def::on::serving::active,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::serving::idle,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>&,vending::events::power_off_const&,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&)>
      ::function<afsm::transitions::detail::final_state_exit_func<0ul>,void>
                ((function<void(std::tuple<afsm::state<vending::vending_def::on::serving::active,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::serving::idle,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>&,vending::events::power_off_const&,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&)>
                  *)&state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
                     ::exit_table<const_vending::events::power_off_&,_0UL,_1UL>::_table,&local_11);
      std::
      function<void(std::tuple<afsm::state<vending::vending_def::on::serving::active,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::serving::idle,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>&,vending::events::power_off_const&,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&)>
      ::function<afsm::transitions::detail::final_state_exit_func<1ul>,void>
                ((function<void(std::tuple<afsm::state<vending::vending_def::on::serving::active,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::serving::idle,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>&,vending::events::power_off_const&,afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&)>
                  *)(state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
                     ::exit_table<const_vending::events::power_off_&,_0UL,_1UL>::_table._M_elems + 1
                    ),&local_12);
      __cxa_atexit(std::
                   array<std::function<void_(std::tuple<afsm::state<vending::vending_def::on::serving::active,_afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::serving::idle,_afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_const_vending::events::power_off_&,_afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&)>,_2UL>
                   ::~array,&state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
                             ::exit_table<const_vending::events::power_off_&,_0UL,_1UL>::_table,
                   &__dso_handle);
      __cxa_guard_release(&exit_table<vending::events::power_off_const&,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
          ::exit_table<const_vending::events::power_off_&,_0UL,_1UL>::_table;
}

Assistant:

static exit_table_type<Event> const&
    exit_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static exit_table_type<Event> _table {{
            detail::final_state_exit_func<Indexes>{} ...
        }};
        return _table;
    }